

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kmax_distance.cpp
# Opt level: O1

double __thiscall
ProbabEstimator::getProbab(ProbabEstimator *this,double *vecMaxs,int numReplaced,int pathLength)

{
  int numReplaced_00;
  double dVar1;
  double dVar2;
  
  numReplaced_00 = this->numMaxs;
  if (numReplaced == 0) {
    dVar1 = getProbabGt(this,vecMaxs[(long)numReplaced_00 + -1],0,pathLength);
  }
  else if (numReplaced_00 == numReplaced) {
    dVar1 = getProbabLt(this,*vecMaxs,numReplaced_00,pathLength);
  }
  else {
    dVar2 = getProbabLt(this,vecMaxs[numReplaced_00 - numReplaced],numReplaced,pathLength);
    dVar1 = getProbabGt(this,vecMaxs[~numReplaced + this->numMaxs],numReplaced,pathLength);
    dVar1 = dVar1 + dVar2;
  }
  return 1.0 - dVar1;
}

Assistant:

double ProbabEstimator::getProbab( const double *vecMaxs, const int numReplaced, const int pathLength ){
    if ( numReplaced == 0 ) return 1.0 - getProbabGt( vecMaxs[numMaxs-1], 0, pathLength );
    if ( numReplaced == numMaxs ) return 1.0 - getProbabLt( vecMaxs[0], numMaxs, pathLength );
    return 1.0 - getProbabLt( vecMaxs[numMaxs-numReplaced], numReplaced, pathLength ) 
               - getProbabGt( vecMaxs[numMaxs-numReplaced-1], numReplaced, pathLength );
}